

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.h
# Opt level: O0

void __thiscall Layer::Layer(Layer *this,int nodes,int nextNodes)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  Index in_stack_ffffffffffffff30;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
  *in_stack_ffffffffffffff38;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  *x;
  Matrix<float,__1,__1,_0,__1,__1> *in_stack_ffffffffffffff40;
  Matrix<float,__1,_1,_0,__1,_1> *this_00;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Eigen::Matrix<float,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Eigen::Matrix<float,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_ffffffffffffff38);
  Eigen::Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
            ((Matrix<float,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff40,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
              *)in_stack_ffffffffffffff38);
  this_00 = (Matrix<float,__1,_1,_0,__1,_1> *)(in_RDI + 0x12);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_ffffffffffffff38);
  Eigen::Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
            (this_00,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                      *)in_stack_ffffffffffffff38);
  x = (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
       *)(in_RDI + 0x16);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Zero((Index)x);
  Eigen::Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
            (this_00,x);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Zero((Index)x);
  Eigen::Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
            (this_00,x);
  return;
}

Assistant:

Layer(int nodes, int nextNodes)
        : size(nodes), nextSize(nextNodes), weights(Eigen::MatrixXf::Zero(nextSize, nodes)),
          weightGrads(Eigen::MatrixXf::Zero(nextSize, size)), bias(Eigen::VectorXf::Zero(size)),
          biasGrads(Eigen::VectorXf::Zero(size)), output(Eigen::VectorXf::Zero(size)),
          loss(Eigen::VectorXf::Zero(size)){}